

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop_helper.c
# Opt level: O0

target_ulong do_check_ieee_exceptions(CPUSPARCState_conflict1 *env,uintptr_t ra)

{
  uint uVar1;
  CPUState *cpu;
  CPUState *cs;
  target_ulong fsr;
  target_ulong status;
  uintptr_t ra_local;
  CPUSPARCState_conflict1 *env_local;
  
  uVar1 = get_float_exception_flags(&env->fp_status);
  cs = (CPUState *)env->fsr;
  if (uVar1 != 0) {
    set_float_exception_flags(0,&env->fp_status);
    if ((uVar1 & 1) != 0) {
      cs = (CPUState *)((ulong)cs | 0x10);
    }
    if ((uVar1 & 8) != 0) {
      cs = (CPUState *)((ulong)cs | 8);
    }
    if ((uVar1 & 0x10) != 0) {
      cs = (CPUState *)((ulong)cs | 4);
    }
    if ((uVar1 & 4) != 0) {
      cs = (CPUState *)((ulong)cs | 2);
    }
    if ((uVar1 & 0x20) != 0) {
      cs = (CPUState *)((ulong)cs | 1);
    }
    if (((ulong)cs & 0x1f & ((ulong)cs & 0xf800000) >> 0x17) != 0) {
      cpu = env_cpu(env);
      env->fsr = (ulong)cs | 0x4000;
      cpu->exception_index = 0x21;
      cpu_loop_exit_restore_sparc64(cpu,ra);
    }
    cs = (CPUState *)(((ulong)cs & 0x1f) << 5 | (ulong)cs);
  }
  return (target_ulong)cs;
}

Assistant:

static target_ulong do_check_ieee_exceptions(CPUSPARCState *env, uintptr_t ra)
{
    target_ulong status = get_float_exception_flags(&env->fp_status);
    target_ulong fsr = env->fsr;

    if (unlikely(status)) {
        /* Keep exception flags clear for next time.  */
        set_float_exception_flags(0, &env->fp_status);

        /* Copy IEEE 754 flags into FSR */
        if (status & float_flag_invalid) {
            fsr |= FSR_NVC;
        }
        if (status & float_flag_overflow) {
            fsr |= FSR_OFC;
        }
        if (status & float_flag_underflow) {
            fsr |= FSR_UFC;
        }
        if (status & float_flag_divbyzero) {
            fsr |= FSR_DZC;
        }
        if (status & float_flag_inexact) {
            fsr |= FSR_NXC;
        }

        if ((fsr & FSR_CEXC_MASK) & ((fsr & FSR_TEM_MASK) >> 23)) {
            CPUState *cs = env_cpu(env);

            /* Unmasked exception, generate a trap.  Note that while
               the helper is marked as NO_WG, we can get away with
               writing to cpu state along the exception path, since
               TCG generated code will never see the write.  */
            env->fsr = fsr | FSR_FTT_IEEE_EXCP;
            cs->exception_index = TT_FP_EXCP;
            cpu_loop_exit_restore(cs, ra);
        } else {
            /* Accumulate exceptions */
            fsr |= (fsr & FSR_CEXC_MASK) << 5;
        }
    }

    return fsr;
}